

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGig.c
# Opt level: O1

void Gia_ManPrintDelays(Vec_Int_t *vObjs,Vec_Int_t *vStore)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  void *__s;
  long lVar5;
  int iVar6;
  long lVar7;
  
  lVar7 = (long)vObjs->nSize + 100;
  iVar6 = (int)lVar7;
  iVar4 = 0x10;
  if (0xe < vObjs->nSize + 99U) {
    iVar4 = iVar6;
  }
  if (iVar4 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar4 << 2);
  }
  memset(__s,0,lVar7 * 4);
  iVar4 = vObjs->nSize;
  if (0 < (long)iVar4) {
    piVar2 = vObjs->pArray;
    lVar7 = 0;
    do {
      lVar5 = (long)piVar2[lVar7];
      if ((lVar5 < 0) || (vStore->nSize <= piVar2[lVar7])) goto LAB_006af183;
      piVar3 = vStore->pArray;
      if (piVar3[lVar5 + 1] == 8) {
        if (piVar3[lVar5 + 2] != 1) {
          __assert_fail("pEntry[2] == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                        ,0x71,"void Gia_ManPrintDelays(Vec_Int_t *, Vec_Int_t *)");
        }
        iVar1 = piVar3[lVar5 + 3];
        if (((long)iVar1 < 0) || (iVar6 <= iVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        piVar3 = (int *)((long)__s + (long)iVar1 * 4);
        *piVar3 = *piVar3 + 1;
      }
      lVar7 = lVar7 + 1;
    } while (iVar4 != lVar7);
  }
  if (0 < vObjs->nSize) {
    lVar7 = 0;
    do {
      lVar5 = (long)vObjs->pArray[lVar7];
      if ((lVar5 < 0) || (vStore->nSize <= vObjs->pArray[lVar7])) {
LAB_006af183:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      if (vStore->pArray[lVar5 + 1] == 6) {
        piVar2 = vStore->pArray + lVar5;
        iVar4 = *piVar2;
        if (((long)iVar4 < 0) || (iVar6 <= iVar4)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        printf("(%d,%d,%d)  ",(long)piVar2[2],(ulong)*(uint *)((long)__s + (long)iVar4 * 4),
               (ulong)(uint)piVar2[(long)piVar2[2] + 3]);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < vObjs->nSize);
  }
  putchar(10);
  if (__s != (void *)0x0) {
    free(__s);
    return;
  }
  return;
}

Assistant:

void Gia_ManPrintDelays( Vec_Int_t * vObjs, Vec_Int_t * vStore )
{
    Vec_Int_t * vFanCount = Vec_IntStart( Vec_IntSize(vObjs) + 100 );
    int i, * pEntry;//, Counter = 0;
    for ( i = 0; i < Vec_IntSize(vObjs); i++ )
    {
        pEntry = Vec_IntEntryP( vStore, Vec_IntEntry(vObjs,i) );
        if ( pEntry[1] != GIG_SEL )
            continue;
        assert( pEntry[2] == 1 );
        Vec_IntAddToEntry( vFanCount, pEntry[3], 1 );
    }
    for ( i = 0; i < Vec_IntSize(vObjs); i++ )
    {
        pEntry = Vec_IntEntryP( vStore, Vec_IntEntry(vObjs,i) );
        if ( pEntry[1] != GIG_DELAY )
            continue;
        printf( "(%d,%d,%d)  ", pEntry[2], Vec_IntEntry(vFanCount, pEntry[0]), pEntry[3+pEntry[2]] );
    }
    printf( "\n" );
    Vec_IntFree( vFanCount );
}